

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O1

TA_RetCode
TA_MACDFIX_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                  int *outNBElement)

{
  TA_ParamHolderOutput *pTVar1;
  TA_RetCode TVar2;
  
  pTVar1 = params->out;
  TVar2 = TA_MACDFIX(startIdx,endIdx,(params->in->data).inReal,(params->optIn->data).optInInteger,
                     outBegIdx,outNBElement,(pTVar1->data).outReal,pTVar1[1].data.outReal,
                     pTVar1[2].data.outReal);
  return TVar2;
}

Assistant:

TA_RetCode TA_MACDFIX_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MACDFIX(
/* Generated */                 startIdx,
/* Generated */                 endIdx,
/* Generated */                 params->in[0].data.inReal, /* inReal */
/* Generated */                 params->optIn[0].data.optInInteger, /* optInSignalPeriod*/
/* Generated */                 outBegIdx, 
/* Generated */                 outNBElement, 
/* Generated */                 params->out[0].data.outReal, /*  outMACD */
/* Generated */                 params->out[1].data.outReal, /*  outMACDSignal */
/* Generated */                 params->out[2].data.outReal /*  outMACDHist */ );
/* Generated */ }